

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<14,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int i;
  undefined8 in_RAX;
  bool bVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  int col;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar12;
  float fVar13;
  float afStack_88 [2];
  Mat3x2 m;
  float afStack_68 [2];
  Matrix<float,_2,_3> retVal;
  float local_48 [2];
  Vector<float,_3> res;
  undefined8 local_28;
  float local_20;
  int aiStack_18 [5];
  undefined4 uStack_4;
  long lVar11;
  
  pfVar1 = afStack_88 + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    pfVar6 = afStack_88;
    bVar12 = true;
    do {
      bVar4 = bVar12;
      lVar8 = 0;
      auVar9 = _DAT_00a99400;
      do {
        bVar12 = SUB164(auVar9 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar12) {
          fVar13 = 1.0;
          if (lVar5 != lVar8) {
            fVar13 = 0.0;
          }
          pfVar6[lVar8 * 2] = fVar13;
        }
        if (bVar12) {
          fVar13 = 1.0;
          if (lVar5 + -1 != lVar8) {
            fVar13 = 0.0;
          }
          pfVar6[lVar8 * 2 + 2] = fVar13;
        }
        lVar8 = lVar8 + 2;
        lVar11 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar11 + 2;
      } while (lVar8 != 4);
      lVar5 = 1;
      pfVar6 = pfVar1;
      bVar12 = false;
    } while (bVar4);
    uVar2 = *(undefined8 *)evalCtx->in[0].m_data;
    uVar3 = *(undefined8 *)evalCtx->in[1].m_data;
    afStack_88[0] = (float)uVar2;
    afStack_88[1] = (float)((ulong)uVar2 >> 0x20);
    m.m_data.m_data[0].m_data[0] = (float)uVar3;
    m.m_data.m_data[0].m_data[1] = (float)((ulong)uVar3 >> 0x20);
    m.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    m.m_data.m_data[1].m_data[1] = evalCtx->in[2].m_data[1];
    m.m_data.m_data[1].m_data[0] = evalCtx->in[2].m_data[0];
  }
  else {
    afStack_88[0] = 0.0;
    afStack_88[1] = 0.0;
    m.m_data.m_data[0].m_data[0] = 0.0;
    m.m_data.m_data[0].m_data[1] = 0.0;
    m.m_data.m_data[1].m_data[0] = 0.0;
    m.m_data.m_data[1].m_data[1] = 0.0;
    lVar5 = 0;
    pfVar6 = afStack_88;
    bVar12 = true;
    do {
      bVar4 = bVar12;
      lVar8 = 0;
      do {
        pfVar6[lVar8 * 2] =
             *(float *)((long)&sr::(anonymous_namespace)::s_constInMat3x2 + lVar5 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar5 = 0xc;
      pfVar6 = pfVar1;
      bVar12 = false;
    } while (bVar4);
  }
  local_28 = CONCAT44(m.m_data.m_data[0].m_data[0] + m.m_data.m_data[0].m_data[1],
                      afStack_88[1] + afStack_88[0]);
  local_20 = m.m_data.m_data[1].m_data[1] + m.m_data.m_data[1].m_data[0];
  afStack_68[0] = 0.0;
  afStack_68[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  lVar5 = 0;
  pfVar6 = afStack_68;
  bVar12 = true;
  do {
    bVar4 = bVar12;
    lVar8 = 0;
    auVar10 = _DAT_00a99400;
    do {
      bVar12 = SUB164(auVar10 ^ _DAT_00a99450,4) == -0x80000000 &&
               SUB164(auVar10 ^ _DAT_00a99450,0) < -0x7ffffffd;
      if (bVar12) {
        fVar13 = 1.0;
        if (lVar5 != lVar8) {
          fVar13 = 0.0;
        }
        pfVar6[lVar8 * 2] = fVar13;
      }
      if (bVar12) {
        fVar13 = 1.0;
        if (lVar5 + -1 != lVar8) {
          fVar13 = 0.0;
        }
        pfVar6[lVar8 * 2 + 2] = fVar13;
      }
      lVar8 = lVar8 + 2;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
    } while (lVar8 != 4);
    lVar5 = 1;
    pfVar6 = afStack_68 + 1;
    bVar12 = false;
  } while (bVar4);
  pfVar6 = afStack_68;
  pfVar7 = afStack_88;
  bVar12 = true;
  do {
    bVar4 = bVar12;
    lVar5 = 0;
    do {
      pfVar6[lVar5 * 2] = pfVar7[lVar5 * 2] + -1.0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    pfVar6 = afStack_68 + 1;
    pfVar7 = pfVar1;
    bVar12 = false;
  } while (bVar4);
  stack0xffffffffffffffc8 =
       CONCAT44(retVal.m_data.m_data[0].m_data[1] + retVal.m_data.m_data[0].m_data[0],
                afStack_68[0] + afStack_68[1]);
  res.m_data[0] = 0.0;
  lVar5 = 0;
  do {
    res.m_data[lVar5 + -2] = *(float *)((long)&local_28 + lVar5 * 4) + res.m_data[lVar5 + 2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  stack0xfffffffffffffff8 = CONCAT44((int)((ulong)in_RAX >> 0x20),2);
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar5]] = retVal.m_data.m_data[2].m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(decrement(in0));
	}